

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

bool __thiscall iDynTree::KinDynComputations::loadRobotModel(KinDynComputations *this,Model *model)

{
  KinDynComputationsPrivateAttributes *pKVar1;
  
  iDynTree::Model::operator=(&this->pimpl->m_robot_model,model);
  pKVar1 = this->pimpl;
  pKVar1->m_isModelValid = true;
  iDynTree::Model::computeFullTreeTraversal((Traversal *)&pKVar1->m_robot_model);
  resizeInternalDataStructures(this);
  pKVar1 = this->pimpl;
  pKVar1->m_isFwdKinematicsUpdated = false;
  pKVar1->m_isRawMassMatrixUpdated = false;
  pKVar1->m_areBiasAccelerationsUpdated = false;
  return true;
}

Assistant:

bool KinDynComputations::loadRobotModel(const Model& model)
{
    this->pimpl->m_robot_model = model;
    this->pimpl->m_isModelValid = true;
    this->pimpl->m_robot_model.computeFullTreeTraversal(this->pimpl->m_traversal);
    this->resizeInternalDataStructures();
    this->invalidateCache();
    return true;
}